

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::UniquenessConstraintSyntax::setChild
          (UniquenessConstraintSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  long in_RDI;
  Token TVar2;
  ConstTokenOrSyntax *in_stack_ffffffffffffff98;
  RangeListSyntax *local_60;
  undefined8 local_40;
  Info *local_38;
  RangeListSyntax *local_30;
  not_null<slang::syntax::RangeListSyntax_*> local_28;
  undefined8 local_20;
  Info *local_18;
  
  if (in_RSI == 0) {
    TVar2 = ConstTokenOrSyntax::token(in_stack_ffffffffffffff98);
    local_20 = TVar2._0_8_;
    *(undefined8 *)(in_RDI + 0x18) = local_20;
    local_18 = TVar2.info;
    *(Info **)(in_RDI + 0x20) = local_18;
  }
  else if (in_RSI == 1) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x755d32);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_60 = (RangeListSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x755d42);
      local_60 = SyntaxNode::as<slang::syntax::RangeListSyntax>(pSVar1);
    }
    local_30 = local_60;
    not_null<slang::syntax::RangeListSyntax_*>::not_null<slang::syntax::RangeListSyntax_*>
              (&local_28,&local_30);
    *(RangeListSyntax **)(in_RDI + 0x28) = local_28.ptr;
  }
  else {
    TVar2 = ConstTokenOrSyntax::token(in_stack_ffffffffffffff98);
    local_40 = TVar2._0_8_;
    *(undefined8 *)(in_RDI + 0x30) = local_40;
    local_38 = TVar2.info;
    *(Info **)(in_RDI + 0x38) = local_38;
  }
  return;
}

Assistant:

void UniquenessConstraintSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: unique = child.token(); return;
        case 1: ranges = child.node() ? &child.node()->as<RangeListSyntax>() : nullptr; return;
        case 2: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}